

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::sse2::BVHNRefitter<4>::recurse_bottom
          (BBox3fa *__return_storage_ptr__,BVHNRefitter<4> *this,NodeRef *ref)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  BBox3fa bounds [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  uVar1 = ref->ptr;
  if ((uVar1 & 8) == 0) {
    lVar2 = 0;
    do {
      if (*(long *)(uVar1 + lVar2) == 8) {
        *(undefined8 *)(local_a8 + lVar2 * 4) = 0x7f8000007f800000;
        *(undefined8 *)(local_a8 + lVar2 * 4 + 8) = 0x7f8000007f800000;
        *(undefined8 *)(local_98 + lVar2 * 4) = 0xff800000ff800000;
        *(undefined8 *)(local_98 + lVar2 * 4 + 8) = 0xff800000ff800000;
      }
      else {
        recurse_bottom((BBox3fa *)&local_c8.field_1,this,(NodeRef *)(uVar1 + lVar2));
        *(undefined8 *)(local_a8 + lVar2 * 4) = local_c8._0_8_;
        *(undefined8 *)(local_a8 + lVar2 * 4 + 8) = local_c8._8_8_;
        *(undefined8 *)(local_98 + lVar2 * 4) = local_b8;
        *(undefined8 *)(local_98 + lVar2 * 4 + 8) = uStack_b0;
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    auVar3 = minps(local_a8,local_88);
    auVar5 = maxps(local_98,local_78);
    *(int *)(uVar1 + 0x20) = local_a8._0_4_;
    *(int *)(uVar1 + 0x24) = local_88._0_4_;
    *(int *)(uVar1 + 0x28) = local_68._0_4_;
    *(int *)(uVar1 + 0x2c) = local_48._0_4_;
    *(int *)(uVar1 + 0x40) = local_a8._4_4_;
    *(int *)(uVar1 + 0x44) = local_88._4_4_;
    *(int *)(uVar1 + 0x48) = local_68._4_4_;
    *(int *)(uVar1 + 0x4c) = local_48._4_4_;
    *(int *)(uVar1 + 0x60) = local_a8._8_4_;
    *(int *)(uVar1 + 100) = local_88._8_4_;
    *(int *)(uVar1 + 0x68) = local_68._8_4_;
    *(int *)(uVar1 + 0x6c) = local_48._8_4_;
    *(int *)(uVar1 + 0x30) = local_98._0_4_;
    *(int *)(uVar1 + 0x34) = local_78._0_4_;
    *(int *)(uVar1 + 0x38) = local_58._0_4_;
    *(int *)(uVar1 + 0x3c) = local_38._0_4_;
    *(int *)(uVar1 + 0x50) = local_98._4_4_;
    *(int *)(uVar1 + 0x54) = local_78._4_4_;
    *(int *)(uVar1 + 0x58) = local_58._4_4_;
    *(int *)(uVar1 + 0x5c) = local_38._4_4_;
    *(int *)(uVar1 + 0x70) = local_98._8_4_;
    *(int *)(uVar1 + 0x74) = local_78._8_4_;
    *(int *)(uVar1 + 0x78) = local_58._8_4_;
    *(int *)(uVar1 + 0x7c) = local_38._8_4_;
    auVar7 = minps(local_68,local_48);
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar3,auVar7);
    auVar3 = maxps(local_58,local_38);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar5,auVar3);
    (__return_storage_ptr__->lower).field_0 = aVar4;
    (__return_storage_ptr__->upper).field_0 = aVar6;
  }
  else {
    (**this->leafBounds->_vptr_LeafBoundsInterface)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa BVHNRefitter<N>::recurse_bottom(NodeRef& ref)
    {
      /* this is a leaf node */
      if (unlikely(ref.isLeaf()))
        return leafBounds.leafBounds(ref);
      
      /* recurse if this is an internal node */
      AABBNode* node = ref.getAABBNode();

      /* enable exclusive prefetch for >= AVX platforms */      
#if defined(__AVX__)      
      BVH::prefetchW(ref);
#endif      
      BBox3fa bounds[N];

      for (size_t i=0; i<N; i++)
        if (unlikely(node->child(i) == BVH::emptyNode))
        {
          bounds[i] = BBox3fa(empty);          
        }
      else
        bounds[i] = recurse_bottom(node->child(i));
      
      /* AOS to SOA transform */
      BBox3vf<N> boundsT = transpose<N>(bounds);
      
      /* set new bounds */
      node->lower_x = boundsT.lower.x;
      node->lower_y = boundsT.lower.y;
      node->lower_z = boundsT.lower.z;
      node->upper_x = boundsT.upper.x;
      node->upper_y = boundsT.upper.y;
      node->upper_z = boundsT.upper.z;

      return merge<N>(bounds);
    }